

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrlist.h
# Opt level: O1

void __thiscall icu_63::NFRuleList::deleteAll(NFRuleList *this)

{
  uint32_t uVar1;
  NFRule **buffer;
  NFRule *this_00;
  void *p;
  int32_t i;
  long lVar2;
  
  uVar1 = this->fCount;
  if (0 < (long)(int)uVar1) {
    lVar2 = 0;
    p = (void *)0x0;
    add(this,(NFRule *)0x0);
    buffer = this->fStuff;
    this->fStuff = (NFRule **)0x0;
    this->fCount = 0;
    this->fCapacity = 0;
    do {
      this_00 = buffer[lVar2];
      if (this_00 != (NFRule *)0x0) {
        NFRule::~NFRule(this_00);
        UMemory::operator_delete((UMemory *)this_00,p);
      }
      lVar2 = lVar2 + 1;
    } while ((int)uVar1 != lVar2);
    if (buffer != (NFRule **)0x0) {
      uprv_free_63(buffer);
      return;
    }
  }
  return;
}

Assistant:

void deleteAll() {
        NFRule** tmp = NULL;
        int32_t size = fCount;
        if (size > 0) {
            tmp = release();
            for (int32_t i = 0; i < size; i++) {
                delete tmp[i];
            }
            if (tmp) {
                uprv_free(tmp);
            }
        }
    }